

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

void assert_table(rtr_socket *socket,aspa_record *records,size_t record_count)

{
  long lVar1;
  aspa_array *paVar2;
  long in_FS_OFFSET;
  ulong local_48;
  size_t k;
  size_t i;
  aspa_array *array;
  aspa_store_node *node;
  size_t record_count_local;
  aspa_record *records_local;
  rtr_socket *socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (socket == (rtr_socket *)0x0) {
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x105,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
  }
  if (socket->aspa_table == (aspa_table *)0x0) {
    __assert_fail("socket->aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x106,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
  }
  if (record_count == 0) {
    for (array = (aspa_array *)socket->aspa_table->store; array != (aspa_array *)0x0;
        array = (aspa_array *)array->data) {
      if ((rtr_socket *)array->capacity == socket) {
        if (*(long *)array == 0) {
          __assert_fail("node->aspa_array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x10e,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        if (**(int **)array != 0) {
          __assert_fail("node->aspa_array->size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x10f,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        break;
      }
    }
  }
  else {
    if (socket->aspa_table->store == (aspa_store_node *)0x0) {
      __assert_fail("socket->aspa_table->store",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11a,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (socket->aspa_table->store->aspa_array == (aspa_array *)0x0) {
      __assert_fail("socket->aspa_table->store->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11b,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (socket->aspa_table->store->rtr_socket == (rtr_socket *)0x0) {
      __assert_fail("socket->aspa_table->store->rtr_socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11c,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (socket->aspa_table->store->rtr_socket != socket) {
      __assert_fail("socket->aspa_table->store->rtr_socket == socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11d,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (socket->aspa_table->store->next != (aspa_store_node *)0x0) {
      __assert_fail("!socket->aspa_table->store->next",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11e,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    paVar2 = socket->aspa_table->store->aspa_array;
    if (paVar2->size != record_count) {
      printf("error: unexpected number of stored records!");
    }
    if (paVar2->size != record_count) {
      __assert_fail("array->size == record_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x125,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (record_count != 0) {
      if (records == (aspa_record *)0x0) {
        __assert_fail("records",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x12a,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)")
        ;
      }
      if (paVar2->data == (aspa_record *)0x0) {
        __assert_fail("array->data",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,299,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
      }
      for (k = 0; k < record_count; k = k + 1) {
        if (paVar2->data[k].customer_asn != records[k].customer_asn) {
          __assert_fail("array->data[i].customer_asn == records[i].customer_asn",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x12e,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        if (paVar2->data[k].provider_count != records[k].provider_count) {
          __assert_fail("array->data[i].provider_count == records[i].provider_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x12f,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        for (local_48 = 0; local_48 < records[k].provider_count; local_48 = local_48 + 1) {
          if (paVar2->data[k].provider_asns[local_48] != records[k].provider_asns[local_48]) {
            __assert_fail("array->data[i].provider_asns[k] == records[i].provider_asns[k]",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                          ,0x132,
                          "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_table(struct rtr_socket *socket, struct aspa_record records[], size_t record_count)
{
	assert(socket);
	assert(socket->aspa_table);

	if (record_count == 0) {
		// Assert no data exists for that socket!
		struct aspa_store_node *node = socket->aspa_table->store;

		while (node) {
			if (node->rtr_socket == socket) {
				assert(node->aspa_array);
				assert(node->aspa_array->size == 0);
				return;
			}

			node = node->next;
		}

		return;
	}

	// Assert data exists for that socket...
	assert(socket->aspa_table->store);
	assert(socket->aspa_table->store->aspa_array);
	assert(socket->aspa_table->store->rtr_socket);
	assert(socket->aspa_table->store->rtr_socket == socket);
	assert(!socket->aspa_table->store->next);

	struct aspa_array *array = socket->aspa_table->store->aspa_array;

	if (array->size != record_count)
		printf("error: unexpected number of stored records!");

	assert(array->size == record_count);

	if (record_count <= 0)
		return;

	assert(records);
	assert(array->data);

	for (size_t i = 0; i < record_count; i++) {
		assert(array->data[i].customer_asn == records[i].customer_asn);
		assert(array->data[i].provider_count == records[i].provider_count);

		for (size_t k = 0; k < records[i].provider_count; k++)
			assert(array->data[i].provider_asns[k] == records[i].provider_asns[k]);
	}
}